

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::DallasWaitIdle(AmpIO *this)

{
  bool bVar1;
  int iVar2;
  uint32_t status;
  ushort local_1c [2];
  
  iVar2 = 0x7d1;
  while( true ) {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return false;
    }
    Amp1394_Sleep(0.001);
    bVar1 = DallasReadStatus(this,(uint32_t *)local_1c);
    if (!bVar1) break;
    if ((local_1c[0] & 0x20f0) == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool AmpIO::DallasWaitIdle()
{
    int i;
    uint32_t status;
    // For each block (256 bytes), wait up to 2000 msec. The actual processing time varies according to system setting.
    // Based on measurements, direct 1-wire interface costs about 250-300 msec to read entire 2048 bytes.
    // For DS2480B serial method, the approximate read time is 5 sec.
    for (i = 0; i < 2000; i++) {
        // Wait 1 msec
        Amp1394_Sleep(0.001);
        if (!DallasReadStatus(status)) return false;
        // Done when in idle state. The following test works for both Firmware Rev 7
        // (state is bits 7:4) and Firmware Rev 8 (state is bits 8:4 and busy flag is bit 13)
        if ((status&0x000020F0) == 0)
            break;
    }
    //std::cerr << "Wait time = " << i << " milliseconds" << std::endl;
    return (i < 2000);
}